

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

void __thiscall chrono::robosimian::RS_Driver::Update(RS_Driver *this,double time)

{
  double dVar1;
  undefined1 auVar2 [16];
  ifstream *piVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  byte bVar33;
  int i_1;
  Actuation *pAVar34;
  ostream *poVar35;
  int i;
  long lVar36;
  Phase PVar37;
  long lVar38;
  undefined8 uVar39;
  PhaseChangeCallback *pPVar40;
  double dVar41;
  double dVar42;
  undefined8 in_XMM0_Qb;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  long *local_50;
  long local_48;
  long local_40 [2];
  double local_30;
  
  PVar37 = this->m_phase;
  if (PVar37 == HOLD) {
    dVar41 = (this->m_actuations_1)._M_elems[0]._M_elems[0];
    dVar42 = (this->m_actuations_1)._M_elems[0]._M_elems[1];
    dVar1 = (this->m_actuations_1)._M_elems[0]._M_elems[2];
    dVar4 = (this->m_actuations_1)._M_elems[0]._M_elems[3];
    dVar5 = (this->m_actuations_1)._M_elems[0]._M_elems[4];
    dVar6 = (this->m_actuations_1)._M_elems[0]._M_elems[5];
    dVar7 = (this->m_actuations_1)._M_elems[0]._M_elems[6];
    dVar8 = (this->m_actuations_1)._M_elems[0]._M_elems[7];
    dVar9 = (this->m_actuations_1)._M_elems[1]._M_elems[0];
    dVar10 = (this->m_actuations_1)._M_elems[1]._M_elems[1];
    dVar11 = (this->m_actuations_1)._M_elems[1]._M_elems[2];
    dVar12 = (this->m_actuations_1)._M_elems[1]._M_elems[3];
    dVar13 = (this->m_actuations_1)._M_elems[1]._M_elems[4];
    dVar14 = (this->m_actuations_1)._M_elems[1]._M_elems[5];
    dVar15 = (this->m_actuations_1)._M_elems[1]._M_elems[6];
    dVar16 = (this->m_actuations_1)._M_elems[1]._M_elems[7];
    dVar17 = (this->m_actuations_1)._M_elems[2]._M_elems[0];
    dVar18 = (this->m_actuations_1)._M_elems[2]._M_elems[1];
    dVar19 = (this->m_actuations_1)._M_elems[2]._M_elems[2];
    dVar20 = (this->m_actuations_1)._M_elems[2]._M_elems[3];
    dVar21 = (this->m_actuations_1)._M_elems[2]._M_elems[4];
    dVar22 = (this->m_actuations_1)._M_elems[2]._M_elems[5];
    dVar23 = (this->m_actuations_1)._M_elems[2]._M_elems[6];
    dVar24 = (this->m_actuations_1)._M_elems[2]._M_elems[7];
    dVar25 = (this->m_actuations_1)._M_elems[3]._M_elems[1];
    dVar26 = (this->m_actuations_1)._M_elems[3]._M_elems[2];
    dVar27 = (this->m_actuations_1)._M_elems[3]._M_elems[3];
    dVar28 = (this->m_actuations_1)._M_elems[3]._M_elems[4];
    dVar29 = (this->m_actuations_1)._M_elems[3]._M_elems[5];
    dVar30 = (this->m_actuations_1)._M_elems[3]._M_elems[6];
    dVar31 = (this->m_actuations_1)._M_elems[3]._M_elems[7];
    (this->m_actuations)._M_elems[3]._M_elems[0] = (this->m_actuations_1)._M_elems[3]._M_elems[0];
    (this->m_actuations)._M_elems[3]._M_elems[1] = dVar25;
    (this->m_actuations)._M_elems[3]._M_elems[2] = dVar26;
    (this->m_actuations)._M_elems[3]._M_elems[3] = dVar27;
    (this->m_actuations)._M_elems[3]._M_elems[4] = dVar28;
    (this->m_actuations)._M_elems[3]._M_elems[5] = dVar29;
    (this->m_actuations)._M_elems[3]._M_elems[6] = dVar30;
    (this->m_actuations)._M_elems[3]._M_elems[7] = dVar31;
    (this->m_actuations)._M_elems[2]._M_elems[0] = dVar17;
    (this->m_actuations)._M_elems[2]._M_elems[1] = dVar18;
    (this->m_actuations)._M_elems[2]._M_elems[2] = dVar19;
    (this->m_actuations)._M_elems[2]._M_elems[3] = dVar20;
    (this->m_actuations)._M_elems[2]._M_elems[4] = dVar21;
    (this->m_actuations)._M_elems[2]._M_elems[5] = dVar22;
    (this->m_actuations)._M_elems[2]._M_elems[6] = dVar23;
    (this->m_actuations)._M_elems[2]._M_elems[7] = dVar24;
    (this->m_actuations)._M_elems[1]._M_elems[0] = dVar9;
    (this->m_actuations)._M_elems[1]._M_elems[1] = dVar10;
    (this->m_actuations)._M_elems[1]._M_elems[2] = dVar11;
    (this->m_actuations)._M_elems[1]._M_elems[3] = dVar12;
    (this->m_actuations)._M_elems[1]._M_elems[4] = dVar13;
    (this->m_actuations)._M_elems[1]._M_elems[5] = dVar14;
    (this->m_actuations)._M_elems[1]._M_elems[6] = dVar15;
    (this->m_actuations)._M_elems[1]._M_elems[7] = dVar16;
    (this->m_actuations)._M_elems[0]._M_elems[0] = dVar41;
    (this->m_actuations)._M_elems[0]._M_elems[1] = dVar42;
    (this->m_actuations)._M_elems[0]._M_elems[2] = dVar1;
    (this->m_actuations)._M_elems[0]._M_elems[3] = dVar4;
    (this->m_actuations)._M_elems[0]._M_elems[4] = dVar5;
    (this->m_actuations)._M_elems[0]._M_elems[5] = dVar6;
    (this->m_actuations)._M_elems[0]._M_elems[6] = dVar7;
    (this->m_actuations)._M_elems[0]._M_elems[7] = dVar8;
    if (time < this->m_offset) {
      return;
    }
    bVar33 = std::__basic_file<char>::is_open();
    this->m_phase = bVar33 ^ CYCLE;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time = ",7);
    poVar35 = std::ostream::_M_insert<double>(time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar35,"  Switch to phase: ",0x13);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,(&m_phase_names_abi_cxx11_)[(ulong)this->m_phase * 4],
               (&DAT_00183078)[(ulong)this->m_phase * 4] +
               (&m_phase_names_abi_cxx11_)[(ulong)this->m_phase * 4]);
    poVar35 = std::__ostream_insert<char,std::char_traits<char>>(poVar35,(char *)local_50,local_48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar35 + -0x18) + (char)poVar35);
    std::ostream::put((char)poVar35);
    std::ostream::flush();
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    pPVar40 = this->m_callback;
    if (pPVar40 == (PhaseChangeCallback *)0x0) {
      return;
    }
    PVar37 = this->m_phase;
    lVar36 = *(long *)pPVar40;
    uVar39 = 1;
  }
  else {
    if (PVar37 != POSE) {
      dVar41 = time - this->m_offset;
      if (PVar37 == CYCLE) {
        if (this->driven != false) {
          return;
        }
        dVar42 = this->m_time_2;
        if (dVar42 < dVar41) {
          pAVar34 = &this->m_actuations_2;
          do {
            this->m_time_1 = dVar42;
            dVar42 = pAVar34->_M_elems[0]._M_elems[0];
            dVar1 = (this->m_actuations_2)._M_elems[0]._M_elems[1];
            dVar4 = (this->m_actuations_2)._M_elems[0]._M_elems[2];
            dVar5 = (this->m_actuations_2)._M_elems[0]._M_elems[3];
            dVar6 = (this->m_actuations_2)._M_elems[0]._M_elems[4];
            dVar7 = (this->m_actuations_2)._M_elems[0]._M_elems[5];
            dVar8 = (this->m_actuations_2)._M_elems[0]._M_elems[6];
            dVar9 = (this->m_actuations_2)._M_elems[0]._M_elems[7];
            dVar10 = (this->m_actuations_2)._M_elems[1]._M_elems[0];
            dVar11 = (this->m_actuations_2)._M_elems[1]._M_elems[1];
            dVar12 = (this->m_actuations_2)._M_elems[1]._M_elems[2];
            dVar13 = (this->m_actuations_2)._M_elems[1]._M_elems[3];
            dVar14 = (this->m_actuations_2)._M_elems[1]._M_elems[4];
            dVar15 = (this->m_actuations_2)._M_elems[1]._M_elems[5];
            dVar16 = (this->m_actuations_2)._M_elems[1]._M_elems[6];
            dVar17 = (this->m_actuations_2)._M_elems[1]._M_elems[7];
            dVar18 = (this->m_actuations_2)._M_elems[2]._M_elems[0];
            dVar19 = (this->m_actuations_2)._M_elems[2]._M_elems[1];
            dVar20 = (this->m_actuations_2)._M_elems[2]._M_elems[2];
            dVar21 = (this->m_actuations_2)._M_elems[2]._M_elems[3];
            dVar22 = (this->m_actuations_2)._M_elems[2]._M_elems[4];
            dVar23 = (this->m_actuations_2)._M_elems[2]._M_elems[5];
            dVar24 = (this->m_actuations_2)._M_elems[2]._M_elems[6];
            dVar25 = (this->m_actuations_2)._M_elems[2]._M_elems[7];
            dVar26 = (this->m_actuations_2)._M_elems[3]._M_elems[1];
            dVar27 = (this->m_actuations_2)._M_elems[3]._M_elems[2];
            dVar28 = (this->m_actuations_2)._M_elems[3]._M_elems[3];
            dVar29 = (this->m_actuations_2)._M_elems[3]._M_elems[4];
            dVar30 = (this->m_actuations_2)._M_elems[3]._M_elems[5];
            dVar31 = (this->m_actuations_2)._M_elems[3]._M_elems[6];
            dVar32 = (this->m_actuations_2)._M_elems[3]._M_elems[7];
            (this->m_actuations_1)._M_elems[3]._M_elems[0] =
                 (this->m_actuations_2)._M_elems[3]._M_elems[0];
            (this->m_actuations_1)._M_elems[3]._M_elems[1] = dVar26;
            (this->m_actuations_1)._M_elems[3]._M_elems[2] = dVar27;
            (this->m_actuations_1)._M_elems[3]._M_elems[3] = dVar28;
            (this->m_actuations_1)._M_elems[3]._M_elems[4] = dVar29;
            (this->m_actuations_1)._M_elems[3]._M_elems[5] = dVar30;
            (this->m_actuations_1)._M_elems[3]._M_elems[6] = dVar31;
            (this->m_actuations_1)._M_elems[3]._M_elems[7] = dVar32;
            (this->m_actuations_1)._M_elems[2]._M_elems[0] = dVar18;
            (this->m_actuations_1)._M_elems[2]._M_elems[1] = dVar19;
            (this->m_actuations_1)._M_elems[2]._M_elems[2] = dVar20;
            (this->m_actuations_1)._M_elems[2]._M_elems[3] = dVar21;
            (this->m_actuations_1)._M_elems[2]._M_elems[4] = dVar22;
            (this->m_actuations_1)._M_elems[2]._M_elems[5] = dVar23;
            (this->m_actuations_1)._M_elems[2]._M_elems[6] = dVar24;
            (this->m_actuations_1)._M_elems[2]._M_elems[7] = dVar25;
            (this->m_actuations_1)._M_elems[1]._M_elems[0] = dVar10;
            (this->m_actuations_1)._M_elems[1]._M_elems[1] = dVar11;
            (this->m_actuations_1)._M_elems[1]._M_elems[2] = dVar12;
            (this->m_actuations_1)._M_elems[1]._M_elems[3] = dVar13;
            (this->m_actuations_1)._M_elems[1]._M_elems[4] = dVar14;
            (this->m_actuations_1)._M_elems[1]._M_elems[5] = dVar15;
            (this->m_actuations_1)._M_elems[1]._M_elems[6] = dVar16;
            (this->m_actuations_1)._M_elems[1]._M_elems[7] = dVar17;
            (this->m_actuations_1)._M_elems[0]._M_elems[0] = dVar42;
            (this->m_actuations_1)._M_elems[0]._M_elems[1] = dVar1;
            (this->m_actuations_1)._M_elems[0]._M_elems[2] = dVar4;
            (this->m_actuations_1)._M_elems[0]._M_elems[3] = dVar5;
            (this->m_actuations_1)._M_elems[0]._M_elems[4] = dVar6;
            (this->m_actuations_1)._M_elems[0]._M_elems[5] = dVar7;
            (this->m_actuations_1)._M_elems[0]._M_elems[6] = dVar8;
            (this->m_actuations_1)._M_elems[0]._M_elems[7] = dVar9;
            piVar3 = this->m_ifs;
            if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 2) != 0) {
              if (this->m_repeat != true) {
                return;
              }
              std::ios::clear((int)piVar3 + (int)*(long *)(*(long *)piVar3 + -0x18));
              std::istream::seekg(this->m_ifs,0,0);
              LoadDataLine(this,&this->m_time_1,&this->m_actuations_1);
              LoadDataLine(this,&this->m_time_2,pAVar34);
              this->m_offset = time;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time = ",7);
              poVar35 = std::ostream::_M_insert<double>(time);
              std::__ostream_insert<char,std::char_traits<char>>(poVar35," New cycle",10);
              std::endl<char,std::char_traits<char>>(poVar35);
              pPVar40 = this->m_callback;
              if (pPVar40 == (PhaseChangeCallback *)0x0) {
                return;
              }
              (**(code **)(*(long *)pPVar40 + 0x10))(pPVar40,3,3);
              return;
            }
            LoadDataLine(this,&this->m_time_2,pAVar34);
            dVar42 = this->m_time_2;
          } while (dVar42 < dVar41);
        }
      }
      else if ((PVar37 == START) && (dVar42 = this->m_time_2, dVar42 < dVar41)) {
        pAVar34 = &this->m_actuations_2;
        do {
          this->m_time_1 = dVar42;
          dVar42 = pAVar34->_M_elems[0]._M_elems[0];
          dVar1 = (this->m_actuations_2)._M_elems[0]._M_elems[1];
          dVar4 = (this->m_actuations_2)._M_elems[0]._M_elems[2];
          dVar5 = (this->m_actuations_2)._M_elems[0]._M_elems[3];
          dVar6 = (this->m_actuations_2)._M_elems[0]._M_elems[4];
          dVar7 = (this->m_actuations_2)._M_elems[0]._M_elems[5];
          dVar8 = (this->m_actuations_2)._M_elems[0]._M_elems[6];
          dVar9 = (this->m_actuations_2)._M_elems[0]._M_elems[7];
          dVar10 = (this->m_actuations_2)._M_elems[1]._M_elems[0];
          dVar11 = (this->m_actuations_2)._M_elems[1]._M_elems[1];
          dVar12 = (this->m_actuations_2)._M_elems[1]._M_elems[2];
          dVar13 = (this->m_actuations_2)._M_elems[1]._M_elems[3];
          dVar14 = (this->m_actuations_2)._M_elems[1]._M_elems[4];
          dVar15 = (this->m_actuations_2)._M_elems[1]._M_elems[5];
          dVar16 = (this->m_actuations_2)._M_elems[1]._M_elems[6];
          dVar17 = (this->m_actuations_2)._M_elems[1]._M_elems[7];
          dVar18 = (this->m_actuations_2)._M_elems[2]._M_elems[0];
          dVar19 = (this->m_actuations_2)._M_elems[2]._M_elems[1];
          dVar20 = (this->m_actuations_2)._M_elems[2]._M_elems[2];
          dVar21 = (this->m_actuations_2)._M_elems[2]._M_elems[3];
          dVar22 = (this->m_actuations_2)._M_elems[2]._M_elems[4];
          dVar23 = (this->m_actuations_2)._M_elems[2]._M_elems[5];
          dVar24 = (this->m_actuations_2)._M_elems[2]._M_elems[6];
          dVar25 = (this->m_actuations_2)._M_elems[2]._M_elems[7];
          dVar26 = (this->m_actuations_2)._M_elems[3]._M_elems[1];
          dVar27 = (this->m_actuations_2)._M_elems[3]._M_elems[2];
          dVar28 = (this->m_actuations_2)._M_elems[3]._M_elems[3];
          dVar29 = (this->m_actuations_2)._M_elems[3]._M_elems[4];
          dVar30 = (this->m_actuations_2)._M_elems[3]._M_elems[5];
          dVar31 = (this->m_actuations_2)._M_elems[3]._M_elems[6];
          dVar32 = (this->m_actuations_2)._M_elems[3]._M_elems[7];
          (this->m_actuations_1)._M_elems[3]._M_elems[0] =
               (this->m_actuations_2)._M_elems[3]._M_elems[0];
          (this->m_actuations_1)._M_elems[3]._M_elems[1] = dVar26;
          (this->m_actuations_1)._M_elems[3]._M_elems[2] = dVar27;
          (this->m_actuations_1)._M_elems[3]._M_elems[3] = dVar28;
          (this->m_actuations_1)._M_elems[3]._M_elems[4] = dVar29;
          (this->m_actuations_1)._M_elems[3]._M_elems[5] = dVar30;
          (this->m_actuations_1)._M_elems[3]._M_elems[6] = dVar31;
          (this->m_actuations_1)._M_elems[3]._M_elems[7] = dVar32;
          (this->m_actuations_1)._M_elems[2]._M_elems[0] = dVar18;
          (this->m_actuations_1)._M_elems[2]._M_elems[1] = dVar19;
          (this->m_actuations_1)._M_elems[2]._M_elems[2] = dVar20;
          (this->m_actuations_1)._M_elems[2]._M_elems[3] = dVar21;
          (this->m_actuations_1)._M_elems[2]._M_elems[4] = dVar22;
          (this->m_actuations_1)._M_elems[2]._M_elems[5] = dVar23;
          (this->m_actuations_1)._M_elems[2]._M_elems[6] = dVar24;
          (this->m_actuations_1)._M_elems[2]._M_elems[7] = dVar25;
          (this->m_actuations_1)._M_elems[1]._M_elems[0] = dVar10;
          (this->m_actuations_1)._M_elems[1]._M_elems[1] = dVar11;
          (this->m_actuations_1)._M_elems[1]._M_elems[2] = dVar12;
          (this->m_actuations_1)._M_elems[1]._M_elems[3] = dVar13;
          (this->m_actuations_1)._M_elems[1]._M_elems[4] = dVar14;
          (this->m_actuations_1)._M_elems[1]._M_elems[5] = dVar15;
          (this->m_actuations_1)._M_elems[1]._M_elems[6] = dVar16;
          (this->m_actuations_1)._M_elems[1]._M_elems[7] = dVar17;
          (this->m_actuations_1)._M_elems[0]._M_elems[0] = dVar42;
          (this->m_actuations_1)._M_elems[0]._M_elems[1] = dVar1;
          (this->m_actuations_1)._M_elems[0]._M_elems[2] = dVar4;
          (this->m_actuations_1)._M_elems[0]._M_elems[3] = dVar5;
          (this->m_actuations_1)._M_elems[0]._M_elems[4] = dVar6;
          (this->m_actuations_1)._M_elems[0]._M_elems[5] = dVar7;
          (this->m_actuations_1)._M_elems[0]._M_elems[6] = dVar8;
          (this->m_actuations_1)._M_elems[0]._M_elems[7] = dVar9;
          if (((byte)this->m_ifs[*(long *)(*(long *)this->m_ifs + -0x18) + 0x20] & 2) != 0) {
            this->m_phase = CYCLE;
            this->m_ifs = &this->m_ifs_cycle;
            LoadDataLine(this,&this->m_time_1,&this->m_actuations_1);
            LoadDataLine(this,&this->m_time_2,pAVar34);
            this->m_offset = time;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time = ",7);
            poVar35 = std::ostream::_M_insert<double>(time);
            std::__ostream_insert<char,std::char_traits<char>>(poVar35,"  Switch to phase: ",0x13);
            local_50 = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,(&m_phase_names_abi_cxx11_)[(ulong)this->m_phase * 4],
                       (&DAT_00183078)[(ulong)this->m_phase * 4] +
                       (&m_phase_names_abi_cxx11_)[(ulong)this->m_phase * 4]);
            poVar35 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar35,(char *)local_50,local_48);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar35 + -0x18) + (char)poVar35);
            std::ostream::put((char)poVar35);
            std::ostream::flush();
            if (local_50 != local_40) {
              operator_delete(local_50,local_40[0] + 1);
            }
            pPVar40 = this->m_callback;
            if (pPVar40 == (PhaseChangeCallback *)0x0) {
              return;
            }
            lVar36 = *(long *)pPVar40;
            uVar39 = 2;
            PVar37 = CYCLE;
            goto LAB_0014397a;
          }
          LoadDataLine(this,&this->m_time_2,pAVar34);
          dVar42 = this->m_time_2;
        } while (dVar42 < dVar41);
      }
      dVar42 = this->m_time_1;
      dVar1 = this->m_time_2;
      auVar43._0_8_ = (dVar41 - dVar1) / (dVar42 - dVar1);
      auVar43._8_8_ = 0;
      pAVar34 = &this->m_actuations;
      lVar36 = 0;
      do {
        lVar38 = 0;
        do {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)((long)pAVar34[-2]._M_elems[0]._M_elems + lVar38);
          auVar45._8_8_ = 0;
          auVar45._0_8_ =
               ((dVar41 - dVar42) / (dVar1 - dVar42)) *
               *(double *)((long)pAVar34[-1]._M_elems[0]._M_elems + lVar38);
          auVar2 = vfmadd231sd_fma(auVar45,auVar43,auVar2);
          *(long *)((long)pAVar34->_M_elems[0]._M_elems + lVar38) = auVar2._0_8_;
          lVar38 = lVar38 + 8;
        } while (lVar38 != 0x40);
        lVar36 = lVar36 + 1;
        pAVar34 = (Actuation *)(pAVar34->_M_elems + 1);
      } while (lVar36 != 4);
      return;
    }
    auVar44._0_8_ = time / this->m_time_pose;
    auVar44._8_8_ = in_XMM0_Qb;
    auVar43 = vfmadd213sd_fma(ZEXT816(0x4034000000000000),auVar44,ZEXT816(0xc024000000000000));
    local_30 = auVar43._0_8_;
    dVar41 = exp(local_30);
    dVar42 = exp(local_30);
    pAVar34 = &this->m_actuations;
    lVar36 = 0;
    do {
      lVar38 = 0;
      do {
        *(double *)((long)pAVar34->_M_elems[0]._M_elems + lVar38) =
             (dVar41 / (dVar42 + 1.0)) *
             *(double *)((long)pAVar34[-2]._M_elems[0]._M_elems + lVar38);
        lVar38 = lVar38 + 8;
      } while (lVar38 != 0x40);
      lVar36 = lVar36 + 1;
      pAVar34 = (Actuation *)(pAVar34->_M_elems + 1);
    } while (lVar36 != 4);
    if (time < this->m_time_pose) {
      return;
    }
    this->m_phase = HOLD;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time = ",7);
    poVar35 = std::ostream::_M_insert<double>(time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar35,"  Switch to phase: ",0x13);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,(&m_phase_names_abi_cxx11_)[(ulong)this->m_phase * 4],
               (&DAT_00183078)[(ulong)this->m_phase * 4] +
               (&m_phase_names_abi_cxx11_)[(ulong)this->m_phase * 4]);
    poVar35 = std::__ostream_insert<char,std::char_traits<char>>(poVar35,(char *)local_50,local_48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar35 + -0x18) + (char)poVar35);
    std::ostream::put((char)poVar35);
    std::ostream::flush();
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    pPVar40 = this->m_callback;
    if (pPVar40 == (PhaseChangeCallback *)0x0) {
      return;
    }
    PVar37 = this->m_phase;
    lVar36 = *(long *)pPVar40;
    uVar39 = 0;
  }
LAB_0014397a:
  (**(code **)(lVar36 + 0x10))(pPVar40,uVar39,PVar37);
  return;
}

Assistant:

void RS_Driver::Update(double time) {
    bool ext_actuation = false;
    // In the POSE phase, use a logistic function to reach first data entry
    if (m_phase == POSE) {
        ax op;
        double x = 20 * (time / m_time_pose) - 10;
        op.a = std::exp(x) / (1 + std::exp(x));
        for (int i = 0; i < 4; i++) {
            std::transform(m_actuations_1[i].begin(), m_actuations_1[i].end(), m_actuations[i].begin(), op);
        }
        if (time >= m_time_pose) {
            m_phase = HOLD;
            std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
            if (m_callback)
                m_callback->OnPhaseChange(POSE, m_phase);
        }
        return;
    }

    // In the HOLD phase, always use the first data entry
    if (m_phase == HOLD) {
        m_actuations = m_actuations_1;
        if (time >= m_offset) {
            m_phase = (m_ifs_start.is_open()) ? START : CYCLE;
            std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
            if (m_callback)
                m_callback->OnPhaseChange(HOLD, m_phase);
        }
        return;
    }

    // Offset time
    double t = time - m_offset;

    switch (m_phase) {
        case START:
            while (t > m_time_2) {
                m_time_1 = m_time_2;
                m_actuations_1 = m_actuations_2;
                if (!m_ifs->eof()) {
                    LoadDataLine(m_time_2, m_actuations_2);
                } else {
                    m_phase = CYCLE;
                    m_ifs = &m_ifs_cycle;
                    LoadDataLine(m_time_1, m_actuations_1);
                    LoadDataLine(m_time_2, m_actuations_2);
                    m_offset = time;
                    std::cout << "time = " << time << "  Switch to phase: " << GetCurrentPhase() << std::endl;
                    if (m_callback)
                        m_callback->OnPhaseChange(START, CYCLE);
                    return;
                }
            }

            break;

        case CYCLE:
            if (!driven) {
                while (t > m_time_2) {
                    m_time_1 = m_time_2;
                    m_actuations_1 = m_actuations_2;
                    if (m_ifs->eof()) {
                        if (m_repeat) {
                            m_ifs->clear();
                            m_ifs->seekg(0);
                            LoadDataLine(m_time_1, m_actuations_1);
                            LoadDataLine(m_time_2, m_actuations_2);
                            m_offset = time;
                            std::cout << "time = " << time << " New cycle" << std::endl;
                            if (m_callback)
                                m_callback->OnPhaseChange(CYCLE, CYCLE);
                        }
                        return;
                    }
                    LoadDataLine(m_time_2, m_actuations_2);
                }
            } else {
                ext_actuation = true;
            }

            break;

        case STOP:
            //// TODO
            break;

        default:
            break;
    }

    // Interpolate  v = alpha_1 * v_1 + alpha_2 * v_2
    if (!ext_actuation) {
        axpby op;
        op.a1 = (t - m_time_2) / (m_time_1 - m_time_2);
        op.a2 = (t - m_time_1) / (m_time_2 - m_time_1);
        for (int i = 0; i < 4; i++) {
            std::transform(m_actuations_1[i].begin(), m_actuations_1[i].end(), m_actuations_2[i].begin(),
                           m_actuations[i].begin(), op);
        }
    }
}